

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

FaceData * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
tryInsert(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
          *this,ReductionKey *key,FaceData *value,size_t *newMemUsed)

{
  Entry *pEVar1;
  uint32_t uVar2;
  bool bVar3;
  Entry *pEVar4;
  FaceData *pFVar5;
  ulong uVar6;
  uint uVar7;
  
  pEVar4 = lockEntriesAndGrowIfNeeded(this,newMemUsed);
  uVar2 = this->_numEntries;
  uVar6 = key->_val;
  pFVar5 = (FaceData *)0x0;
  do {
    uVar7 = (uint)uVar6 & uVar2 - 1;
    pEVar1 = pEVar4 + uVar7;
    if (pEVar4[uVar7].value == (FaceData *)0x0) {
      pEVar1->value = value;
      this->_size = this->_size + 1;
      (pEVar1->key)._val = key->_val;
LAB_004a222a:
      pFVar5 = pEVar1->value;
      bVar3 = false;
    }
    else {
      do {
      } while ((pEVar1->key)._val == -1);
      bVar3 = true;
      if ((pEVar1->key)._val == key->_val) goto LAB_004a222a;
    }
    uVar6 = (ulong)((uint)uVar6 + 1);
    if (!bVar3) {
      this->_entries = pEVar4;
      return pFVar5;
    }
  } while( true );
}

Assistant:

Value tryInsert(Key& key, Value value, size_t& newMemUsed)
    {
        Entry* entries = lockEntriesAndGrowIfNeeded(newMemUsed);
        uint32_t mask = _numEntries-1;
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.value == 0) {
                e.value = value;
                ++_size;
                PtexMemoryFence();
                e.key.copy(key);
                result = e.value;
                break;
            }
            while (e.key.isEmpty()) ;
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
        }
        unlockEntries(entries);
        return result;
    }